

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMakeUtil.cpp
# Opt level: O3

MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *
vkt::pipeline::bindBuffer
          (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *__return_storage_ptr__,
          DeviceInterface *vk,VkDevice device,Allocator *allocator,VkBuffer buffer,
          MemoryRequirement requirement)

{
  Allocation *pAVar1;
  VkResult result;
  VkMemoryRequirements VStack_48;
  
  ::vk::getBufferMemoryRequirements(&VStack_48,vk,device,buffer);
  (*allocator->_vptr_Allocator[3])
            (__return_storage_ptr__,allocator,&VStack_48,(ulong)requirement.m_flags);
  pAVar1 = (__return_storage_ptr__->
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.ptr;
  result = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,buffer.m_internal,(pAVar1->m_memory).m_internal,pAVar1->m_offset);
  ::vk::checkResult(result,
                    "vk.bindBufferMemory(device, buffer, alloc->getMemory(), alloc->getOffset())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMakeUtil.cpp"
                    ,0x124);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<Allocation> bindBuffer (const DeviceInterface& vk, const VkDevice device, Allocator& allocator, const VkBuffer buffer, const MemoryRequirement requirement)
{
	MovePtr<Allocation> alloc(allocator.allocate(getBufferMemoryRequirements(vk, device, buffer), requirement));
	VK_CHECK(vk.bindBufferMemory(device, buffer, alloc->getMemory(), alloc->getOffset()));
	return alloc;
}